

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  _Rb_tree_node_base *p_Var2;
  ostringstream *poVar3;
  ostream *poVar4;
  Precision PVar5;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar6;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  Variable<tcu::Vector<float,_2>_> *pVVar9;
  pointer pcVar10;
  Variable<tcu::Vector<int,_2>_> *pVVar11;
  TestStatus *pTVar12;
  bool bVar13;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  long lVar16;
  IVal *pIVar17;
  IVal *pIVar18;
  undefined8 *puVar19;
  uint uVar20;
  Vector<float,_2> *val;
  Vector<int,_2> *val_00;
  FloatFormat *pFVar21;
  ulong uVar22;
  char *pcVar23;
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
  *pBVar26;
  pointer pVVar27;
  IVal in2;
  FuncSet funcs;
  IVal reference1;
  IVal in3;
  IVal in0;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_> outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  deUint32 in_stack_fffffffffffffaa8;
  string local_550;
  undefined1 local_530 [24];
  _Rb_tree_node_base *local_518;
  _Rb_tree_node_base *local_510;
  double local_508;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
  *local_500;
  IVal local_4f1;
  TestLog *local_4f0;
  pointer local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  FloatFormat *local_4d0;
  string local_4c8;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  double local_488;
  Precision PStack_480;
  undefined4 uStack_47c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_478;
  undefined4 local_470;
  ios_base local_438 [8];
  ios_base local_430 [264];
  TestStatus *local_328;
  pointer local_320;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_318;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  FloatFormat local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  IVal local_1f8 [2];
  ios_base local_188 [264];
  ResultCollector local_80;
  
  this_00 = this->m_samplings;
  pFVar21 = &(this->m_caseCtx).floatFormat;
  PVar5 = (this->m_caseCtx).precision;
  sVar6 = (this->m_caseCtx).numRandoms;
  local_328 = __return_storage_ptr__;
  iVar14 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<int,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<int,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar21,(FloatFormat *)(ulong)PVar5,(Precision)sVar6,(ulong)(iVar14 + 0xdeadbeef),
             in_stack_fffffffffffffaa8);
  pVVar27 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar22 = (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_2e8,uVar22);
  local_4e8 = pVVar27;
  local_2b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_318._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_318._M_impl.super__Rb_tree_header._M_header;
  local_318._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_318._M_impl.super__Rb_tree_header._M_header._M_right =
       local_318._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_4f0 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl
              .super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2e8.out0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_4a8 + 8);
  local_500 = this;
  local_4a8._0_8_ = local_4f0;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_430);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  p_Var2 = (_Rb_tree_node_base *)(local_530 + 8);
  local_530._8_4_ = _S_red;
  local_530._16_8_ = (_Base_ptr)0x0;
  local_508 = 0.0;
  pSVar7 = (local_500->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_518 = p_Var2;
  local_510 = p_Var2;
  local_4d0 = pFVar21;
  (*pSVar7->_vptr_Statement[4])(pSVar7,local_530);
  if (local_518 != p_Var2) {
    p_Var15 = local_518;
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),local_1f8);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var2);
  }
  pFVar21 = local_4d0;
  if (local_508 != 0.0) {
    poVar3 = (ostringstream *)(local_4a8 + 8);
    local_4a8._0_8_ = local_4f0;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,local_550._M_dataplus._M_p,local_550._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_430);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_530);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  pBVar26 = local_500;
  pSVar8 = (local_500->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  local_4d8 = uVar22;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,uVar22 & 0xffffffff,&local_218,&local_288,0);
  lVar16 = 0x10;
  do {
    local_4a8[lVar16 + -0x10] = 0;
    *(undefined8 *)(local_4a8 + lVar16 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_4a8 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    local_4a8[lVar16 + -0x10] = 0;
    *(undefined8 *)(local_4a8 + lVar16 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_4a8 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar16) = 0;
    *(undefined8 *)((long)&local_200 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8[0].m_data[0].m_hasNaN + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar16) = 0;
    *(undefined8 *)((long)&local_200 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8[0].m_data[0].m_hasNaN + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  lVar16 = 0x10;
  do {
    local_530[lVar16 + -0x10] = 0;
    *(undefined8 *)(local_530 + lVar16 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_530 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x40);
  lVar16 = 0x10;
  do {
    local_530[lVar16 + -0x10] = 0;
    *(undefined8 *)(local_530 + lVar16 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_530 + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 == 0x28);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_318,
             (pBVar26->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_4a8);
  Environment::bind<tcu::Vector<int,2>>
            ((Environment *)&local_318,
             (pBVar26->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>.m_ptr,
             local_1f8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (pBVar26->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_550);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (pBVar26->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_318,
             (pBVar26->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_530);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (pBVar26->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_4f1);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == local_4e8) {
    uVar22 = 0;
  }
  else {
    local_320 = (pointer)(local_4d8 + (local_4d8 == 0));
    pVVar27 = (pointer)0x0;
    uVar22 = 0;
    do {
      lVar16 = 0x10;
      do {
        *(undefined1 *)((long)&local_208 + lVar16) = 0;
        *(undefined8 *)((long)&local_200 + lVar16) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8[0].m_data[0].m_hasNaN + lVar16) = 0xfff0000000000000;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x40);
      lVar16 = 0x10;
      do {
        *(undefined1 *)((long)&local_208 + lVar16) = 0;
        *(undefined8 *)((long)&local_200 + lVar16) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8[0].m_data[0].m_hasNaN + lVar16) = 0xfff0000000000000;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 == 0x28);
      local_550._M_dataplus._M_p =
           *(pointer *)
            local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)pVVar27].m_data;
      local_4e8 = pVVar27;
      local_4e0 = uVar22;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_530,pFVar21,(Vector<float,_2> *)&local_550);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_4a8,pFVar21,(IVal *)local_530);
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_318,
                           (pBVar26->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar17->m_data[1].m_lo = local_488;
      pIVar17->m_data[1].m_hi = (double)CONCAT44(uStack_47c,PStack_480);
      pIVar17->m_data[0].m_hi =
           (double)CONCAT44(local_498._M_allocated_capacity._4_4_,
                            local_498._M_allocated_capacity._0_4_);
      *(ulong *)(pIVar17->m_data + 1) = CONCAT44(local_498._12_4_,local_498._8_4_);
      *(undefined8 *)pIVar17->m_data = local_4a8._0_8_;
      pIVar17->m_data[0].m_lo = (double)CONCAT44(local_4a8._12_4_,local_4a8._8_4_);
      local_550._M_dataplus._M_p =
           *(pointer *)
            local_278.in1.
            super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
            super__Vector_impl_data._M_start[(long)local_4e8].m_data;
      ContainerTraits<tcu::Vector<int,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_530,pFVar21,(Vector<int,_2> *)&local_550);
      ContainerTraits<tcu::Vector<int,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_4a8,pFVar21,(IVal *)local_530);
      pIVar18 = Environment::lookup<tcu::Vector<int,2>>
                          ((Environment *)&local_318,
                           (pBVar26->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>
                           .m_ptr);
      pIVar18->m_data[1].m_lo = local_488;
      pIVar18->m_data[1].m_hi = (double)CONCAT44(uStack_47c,PStack_480);
      pIVar18->m_data[0].m_hi =
           (double)CONCAT44(local_498._M_allocated_capacity._4_4_,
                            local_498._M_allocated_capacity._0_4_);
      *(ulong *)(pIVar18->m_data + 1) = CONCAT44(local_498._12_4_,local_498._8_4_);
      *(undefined8 *)pIVar18->m_data = local_4a8._0_8_;
      pIVar18->m_data[0].m_lo = (double)CONCAT44(local_4a8._12_4_,local_4a8._8_4_);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_318,
                 (pBVar26->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_318,
                 (pBVar26->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      PStack_480 = (pBVar26->m_caseCtx).precision;
      local_488 = pFVar21->m_maxValue;
      local_4a8._0_8_ = *(undefined8 *)pFVar21;
      local_4a8._8_4_ = pFVar21->m_fractionBits;
      local_4a8._12_4_ = pFVar21->m_hasSubnormal;
      local_498._M_allocated_capacity._0_4_ = pFVar21->m_hasInf;
      local_498._M_allocated_capacity._4_4_ = pFVar21->m_hasNaN;
      local_498._8_1_ = pFVar21->m_exactPrecision;
      local_498._9_3_ = *(undefined3 *)&pFVar21->field_0x19;
      local_498._12_4_ = *(undefined4 *)&pFVar21->field_0x1c;
      local_470 = 0;
      pSVar7 = (pBVar26->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_478 = &local_318;
      (*pSVar7->_vptr_Statement[3])(pSVar7,local_4a8);
      pIVar17 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_318,
                           (pBVar26->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_4a8,&local_2b8,pIVar17);
      pVVar27 = local_4e8;
      local_1f8[0].m_data[0].m_lo = (double)CONCAT44(local_4a8._12_4_,local_4a8._8_4_);
      local_1f8[0].m_data[0].m_hi =
           (double)CONCAT44(local_498._M_allocated_capacity._4_4_,
                            local_498._M_allocated_capacity._0_4_);
      local_1f8[0].m_data[1]._4_4_ = local_498._12_4_;
      local_1f8[0].m_data[1]._0_4_ = local_498._8_4_;
      local_1f8[0].m_data[1].m_hi = (double)CONCAT44(uStack_47c,PStack_480);
      local_1f8[0].m_data[1].m_lo = local_488;
      local_1f8[0].m_data[0]._0_8_ = local_4a8._0_8_;
      bVar13 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                         (local_1f8,
                          local_2e8.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_4e8);
      local_4a8._0_8_ = local_4a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(&local_80,bVar13,(string *)local_4a8);
      if ((TestLog *)local_4a8._0_8_ != (TestLog *)(local_4a8 + 0x10)) {
        operator_delete((void *)local_4a8._0_8_,
                        CONCAT44(local_498._M_allocated_capacity._4_4_,
                                 local_498._M_allocated_capacity._0_4_) + 1);
      }
      uVar20 = (int)local_4e0 + ((byte)~bVar13 & 1);
      uVar22 = (ulong)uVar20;
      if ((int)uVar20 < 0x65 && !bVar13) {
        local_4a8._0_8_ = local_4f0;
        poVar3 = (ostringstream *)(local_4a8 + 8);
        local_4e0 = (ulong)uVar20;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        pcVar23 = "Failed";
        if (bVar13) {
          pcVar23 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar23,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar9 = (local_500->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr
        ;
        val = (Vector<float,_2> *)(local_530 + 0x10);
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_530._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_530,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_530._0_8_,
                   CONCAT44(local_530._12_4_,local_530._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,2>>
                  (&local_550,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar27),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),local_550._M_dataplus._M_p,local_550._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_2> *)local_530._0_8_ != (Vector<float,_2> *)(local_530 + 0x10)) {
          operator_delete((void *)local_530._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_530._16_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\t",1);
        pVVar11 = (local_500->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_2>_>_>.m_ptr;
        val_00 = (Vector<int,_2> *)(local_530 + 0x10);
        pcVar10 = (pVVar11->m_name)._M_dataplus._M_p;
        local_530._0_8_ = val_00;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_530,pcVar10,pcVar10 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_530._0_8_,
                   CONCAT44(local_530._12_4_,local_530._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<int,2>>
                  (&local_550,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in1.
                    super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + (long)pVVar27),val_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),local_550._M_dataplus._M_p,local_550._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<int,_2> *)local_530._0_8_ != (Vector<int,_2> *)(local_530 + 0x10)) {
          operator_delete((void *)local_530._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_530._16_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8),"\t",1);
        pVVar9 = (local_500->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr
        ;
        pIVar17 = (IVal *)(local_530 + 0x10);
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_530._0_8_ = pIVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_530,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4a8 + 8),(char *)local_530._0_8_,
                   CONCAT44(local_530._12_4_,local_530._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,2>>
                  (&local_550,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_2e8.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar27),
                   (Vector<float,_2> *)pIVar17);
        poVar4 = (ostream *)(local_4a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_550._M_dataplus._M_p,local_550._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_4c8,(shaderexecutor *)&local_2b8,(FloatFormat *)local_1f8,pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_4c8._M_dataplus._M_p,local_4c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_530._0_8_ != (IVal *)(local_530 + 0x10)) {
          operator_delete((void *)local_530._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_530._16_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4a8 + 8));
        std::ios_base::~ios_base(local_430);
        uVar22 = local_4e0;
        pVVar27 = local_4e8;
      }
      pVVar27 = (pointer)((long)pVVar27->m_data + 1);
      pFVar21 = local_4d0;
      pBVar26 = local_500;
    } while (pVVar27 != local_320);
  }
  pTVar12 = local_328;
  iVar14 = (int)uVar22;
  if (100 < iVar14) {
    poVar3 = (ostringstream *)(local_4a8 + 8);
    local_4a8._0_8_ = local_4f0;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar14 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_430);
  }
  poVar3 = (ostringstream *)(local_4a8 + 8);
  if (iVar14 == 0) {
    local_4a8._0_8_ = local_4f0;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4a8._0_8_ = local_4f0;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_430);
  if (iVar14 == 0) {
    local_4a8._0_8_ = (IVal *)(local_4a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Pass","");
    pTVar12->m_code = QP_TEST_RESULT_PASS;
    (pTVar12->m_description)._M_dataplus._M_p = (pointer)&(pTVar12->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar12->m_description,local_4a8._0_8_,
               (pointer)(local_4a8._0_8_ + CONCAT44(local_4a8._12_4_,local_4a8._8_4_)));
    if ((IVal *)local_4a8._0_8_ == (IVal *)(local_4a8 + 0x10)) goto LAB_009ba0df;
    p_Var25 = (_Base_ptr)
              CONCAT44(local_498._M_allocated_capacity._4_4_,local_498._M_allocated_capacity._0_4_);
    pIVar17 = (IVal *)local_4a8._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
    std::ostream::operator<<(local_4a8,iVar14);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    std::ios_base::~ios_base(local_438);
    pIVar17 = (IVal *)(local_4a8 + 0x10);
    local_4a8._0_8_ = pIVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8," test failed. Check log for the details","");
    p_Var25 = (_Base_ptr)
              (CONCAT44(local_4a8._12_4_,local_4a8._8_4_) +
              CONCAT44(local_530._12_4_,local_530._8_4_));
    p_Var24 = (_Base_ptr)0xf;
    if ((IVal *)local_530._0_8_ != (IVal *)(local_530 + 0x10)) {
      p_Var24 = (_Base_ptr)local_530._16_8_;
    }
    if (p_Var24 < p_Var25) {
      p_Var24 = (_Base_ptr)0xf;
      if ((IVal *)local_4a8._0_8_ != pIVar17) {
        p_Var24 = (_Base_ptr)
                  CONCAT44(local_498._M_allocated_capacity._4_4_,
                           local_498._M_allocated_capacity._0_4_);
      }
      if (p_Var24 < p_Var25) goto LAB_009b9f74;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_4a8,0,(char *)0x0,local_530._0_8_);
    }
    else {
LAB_009b9f74:
      puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_530,local_4a8._0_8_);
    }
    local_1f8[0].m_data[0]._0_8_ = &local_1f8[0].m_data[0].m_hi;
    pdVar1 = (double *)(puVar19 + 2);
    if ((double *)*puVar19 == pdVar1) {
      local_1f8[0].m_data[0].m_hi = *pdVar1;
      local_1f8[0].m_data[1]._0_8_ = puVar19[3];
    }
    else {
      local_1f8[0].m_data[0].m_hi = *pdVar1;
      local_1f8[0].m_data[0]._0_8_ = (double *)*puVar19;
    }
    local_1f8[0].m_data[0].m_lo = (double)puVar19[1];
    *puVar19 = pdVar1;
    puVar19[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar12->m_code = QP_TEST_RESULT_FAIL;
    (pTVar12->m_description)._M_dataplus._M_p = (pointer)&(pTVar12->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar12->m_description,local_1f8[0].m_data[0]._0_8_,
               (undefined1 *)(local_1f8[0].m_data[0]._0_8_ + (long)local_1f8[0].m_data[0].m_lo));
    if ((double *)local_1f8[0].m_data[0]._0_8_ != &local_1f8[0].m_data[0].m_hi) {
      operator_delete((void *)local_1f8[0].m_data[0]._0_8_,(long)local_1f8[0].m_data[0].m_hi + 1);
    }
    if ((IVal *)local_4a8._0_8_ != pIVar17) {
      operator_delete((void *)local_4a8._0_8_,
                      CONCAT44(local_498._M_allocated_capacity._4_4_,
                               local_498._M_allocated_capacity._0_4_) + 1);
    }
    p_Var25 = (_Base_ptr)local_530._16_8_;
    pIVar17 = (IVal *)local_530._0_8_;
    if ((IVal *)local_530._0_8_ == (IVal *)(local_530 + 0x10)) goto LAB_009ba0df;
  }
  operator_delete(pIVar17,(ulong)((long)&p_Var25->_M_color + 1));
LAB_009ba0df:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_318);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar12;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}